

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void doctest::detail::decomp_assert(Enum at,char *file,int line,char *expr,Result *result)

{
  code *pcVar1;
  bool bVar2;
  byte extraout_AL;
  ContextOptions *pCVar3;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double __x;
  undefined1 local_138 [8];
  ResultBuilder rb;
  undefined1 local_b0 [8];
  ResultBuilder rb_1;
  bool failed;
  Result *result_local;
  char *expr_local;
  int line_local;
  char *file_local;
  Enum at_local;
  
  rb_1.super_AssertData.m_exception_string._7_1_ = (result->m_passed ^ 0xffU) & 1;
  if ((is_running_in_test & 1) == 0) {
    if (rb_1.super_AssertData.m_exception_string._7_1_ != 0) {
      ResultBuilder::ResultBuilder((ResultBuilder *)local_b0,at,file,line,expr,"","");
      rb_1.super_AssertData.m_expr._0_1_ = rb_1.super_AssertData.m_exception_string._7_1_ & 1;
      String::operator=((String *)((long)&rb_1.super_AssertData.m_exception.field_0 + 0x10),
                        &result->m_decomp);
      failed_out_of_a_testing_context((AssertData *)local_b0);
      bVar2 = isDebuggerActive();
      if ((bVar2) && (pCVar3 = getContextOptions(), (pCVar3->no_breaks & 1U) == 0)) {
        pcVar1 = (code *)swi(3);
        (*pcVar1)();
        return;
      }
      bVar2 = checkIfShouldThrow(at);
      if (bVar2) {
        throwException();
      }
      ResultBuilder::~ResultBuilder((ResultBuilder *)local_b0);
    }
  }
  else {
    ResultBuilder::ResultBuilder((ResultBuilder *)local_138,at,file,line,expr,"","");
    rb.super_AssertData.m_expr._0_1_ = rb_1.super_AssertData.m_exception_string._7_1_ & 1;
    if (((byte)rb.super_AssertData.m_expr != 0) ||
       (pCVar3 = getContextOptions(), __x = extraout_XMM0_Qa, (pCVar3->success & 1U) != 0)) {
      String::operator=((String *)((long)&rb.super_AssertData.m_exception.field_0 + 0x10),
                        &result->m_decomp);
      __x = extraout_XMM0_Qa_00;
    }
    ResultBuilder::log((ResultBuilder *)local_138,__x);
    if ((extraout_AL & 1) != 0) {
      pcVar1 = (code *)swi(3);
      (*pcVar1)();
      return;
    }
    if ((((byte)rb.super_AssertData.m_expr & 1) != 0) && (bVar2 = checkIfShouldThrow(at), bVar2)) {
      throwException();
    }
    ResultBuilder::~ResultBuilder((ResultBuilder *)local_138);
  }
  return;
}

Assistant:

void decomp_assert(assertType::Enum at, const char* file, int line, const char* expr,
                       Result result) {
        bool failed = !result.m_passed;

        // ###################################################################################
        // IF THE DEBUGGER BREAKS HERE - GO 1 LEVEL UP IN THE CALLSTACK FOR THE FAILING ASSERT
        // THIS IS THE EFFECT OF HAVING 'DOCTEST_CONFIG_SUPER_FAST_ASSERTS' DEFINED
        // ###################################################################################
        DOCTEST_ASSERT_OUT_OF_TESTS(result.m_decomp);
        DOCTEST_ASSERT_IN_TESTS(result.m_decomp);
        // NOLINTNEXTLINE(clang-analyzer-cplusplus.NewDeleteLeaks)
    }